

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O2

e_int32 calc_slot_car(OPLL_SLOT *slot,e_int32 fm)

{
  int iVar1;
  
  iVar1 = 0;
  if (slot->egout < 0xff) {
    iVar1 = (int)DB2LIN_TABLE[slot->egout + (uint)slot->sintbl[fm * 8 + slot->pgout & 0x1ff]];
  }
  slot->output[0] = iVar1;
  iVar1 = iVar1 + slot->output[1] >> 1;
  slot->output[1] = iVar1;
  return iVar1;
}

Assistant:

INLINE static e_int32
calc_slot_car (OPLL_SLOT * slot, e_int32 fm)
{
  if (slot->egout >= (DB_MUTE - 1))
  {
    slot->output[0] = 0;
  }
  else
  {
    slot->output[0] = DB2LIN_TABLE[slot->sintbl[(slot->pgout+wave2_8pi(fm))&(PG_WIDTH-1)] + slot->egout];
  }

  slot->output[1] = (slot->output[1] + slot->output[0]) >> 1;
  return slot->output[1];
}